

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# respondent.c
# Opt level: O0

int nn_respondent_send(nn_sockbase *self,nn_msg *msg)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  nn_sockbase *in_RSI;
  nn_chunkref *in_RDI;
  nn_respondent *respondent;
  int rc;
  int in_stack_ffffffffffffffbc;
  nn_chunkref *in_stack_ffffffffffffffc0;
  FILE *__stream;
  undefined7 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcf;
  nn_chunkref *dst;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  if (in_RDI == (nn_chunkref *)0x0) {
    in_RDI = (nn_chunkref *)0x0;
  }
  if (((undefined1  [32])in_RDI[0xd].u & (undefined1  [32])0x1) == (undefined1  [32])0x0) {
    local_4 = -0x9523dfe;
  }
  else {
    dst = in_RDI;
    sVar2 = nn_chunkref_size(in_stack_ffffffffffffffc0);
    if (sVar2 != 0) {
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/respondent.c"
              ,0x76);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_chunkref_term(in_stack_ffffffffffffffc0);
    nn_chunkref_mv(dst,(nn_chunkref *)CONCAT17(in_stack_ffffffffffffffcf,in_stack_ffffffffffffffc8))
    ;
    *(uint *)((long)&in_RDI[0xd].u + 0x10) = *(uint *)((long)&in_RDI[0xd].u + 0x10) & 0xfffffffe;
    iVar1 = nn_xrespondent_send(in_RSI,(nn_msg *)
                                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
                               );
    if (iVar1 != 0 && iVar1 != -0xb) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar3 = nn_err_strerror(in_stack_ffffffffffffffbc);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar3,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/survey/respondent.c"
              ,0x80);
      fflush(_stderr);
      nn_err_abort();
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int nn_respondent_send (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_respondent *respondent;

    respondent = nn_cont (self, struct nn_respondent, xrespondent.sockbase);

    /*  If there's no survey going on, report EFSM error. */
    if (nn_slow (!(respondent->flags & NN_RESPONDENT_INPROGRESS)))
        return -EFSM;

    /*  Tag the message with survey ID. */
    nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &respondent->backtrace);

    /*  Remember that no survey is being processed. */
    respondent->flags &= ~NN_RESPONDENT_INPROGRESS;

    /*  Try to send the message. If it cannot be sent due to pushback, drop it
        silently. */
    rc = nn_xrespondent_send (&respondent->xrespondent.sockbase, msg);
    errnum_assert (rc == 0 || rc == -EAGAIN, -rc);

    return 0;
}